

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O3

void __thiscall
SphereTriangleDetector::getClosestPoints
          (SphereTriangleDetector *this,ClosestPointInput *input,Result *output,
          btIDebugDraw *debugDraw,bool swapResults)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  btScalar *in_R9;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  btScalar depth;
  btVector3 normal;
  btVector3 point;
  btVector3 pointOnA;
  btVector3 normalOnA;
  btScalar local_ac;
  btVector3 local_a8;
  btVector3 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined8 local_58;
  float local_50;
  undefined4 local_4c;
  undefined8 local_48;
  float local_40;
  undefined4 local_3c;
  undefined8 local_38;
  float local_30;
  undefined4 local_2c;
  btVector3 local_28;
  
  local_ac = 0.0;
  fVar13 = (input->m_transformA).m_origin.m_floats[0] - (input->m_transformB).m_origin.m_floats[0];
  fVar10 = (input->m_transformA).m_origin.m_floats[1] - (input->m_transformB).m_origin.m_floats[1];
  fVar8 = (input->m_transformA).m_origin.m_floats[2] - (input->m_transformB).m_origin.m_floats[2];
  fVar11 = (input->m_transformA).m_basis.m_el[0].m_floats[2];
  fVar12 = (input->m_transformA).m_basis.m_el[1].m_floats[2];
  fVar14 = (input->m_transformA).m_basis.m_el[2].m_floats[2];
  fVar1 = (input->m_transformB).m_basis.m_el[0].m_floats[2];
  fVar2 = (input->m_transformB).m_basis.m_el[1].m_floats[2];
  local_88 = ZEXT416((uint)fVar2);
  fVar3 = (input->m_transformB).m_basis.m_el[2].m_floats[2];
  local_30 = fVar3 * fVar14 + fVar1 * fVar11 + fVar12 * fVar2;
  uVar4 = *(undefined8 *)(input->m_transformB).m_basis.m_el[1].m_floats;
  fVar19 = (float)uVar4;
  uVar5 = *(undefined8 *)(input->m_transformB).m_basis.m_el[0].m_floats;
  fVar15 = (float)uVar5;
  uVar6 = *(undefined8 *)(input->m_transformB).m_basis.m_el[2].m_floats;
  fVar17 = (float)uVar6;
  local_50 = fVar17 * fVar14 + fVar15 * fVar11 + fVar19 * fVar12;
  fVar21 = (float)((ulong)uVar4 >> 0x20);
  fVar16 = (float)((ulong)uVar5 >> 0x20);
  fVar18 = (float)((ulong)uVar6 >> 0x20);
  local_40 = fVar14 * fVar18 + fVar11 * fVar16 + fVar12 * fVar21;
  uVar4 = *(undefined8 *)(input->m_transformA).m_basis.m_el[0].m_floats;
  fVar11 = (float)uVar4;
  fVar12 = (float)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)(input->m_transformA).m_basis.m_el[1].m_floats;
  fVar14 = (float)uVar4;
  fVar9 = (float)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)(input->m_transformA).m_basis.m_el[2].m_floats;
  fVar20 = (float)uVar4;
  fVar22 = (float)((ulong)uVar4 >> 0x20);
  local_58 = CONCAT44(fVar17 * fVar22 + fVar15 * fVar12 + fVar19 * fVar9,
                      fVar17 * fVar20 + fVar15 * fVar11 + fVar19 * fVar14);
  local_4c = 0;
  local_48 = CONCAT44(fVar18 * fVar22 + fVar16 * fVar12 + fVar21 * fVar9,
                      fVar18 * fVar20 + fVar16 * fVar11 + fVar21 * fVar14);
  local_3c = 0;
  local_38 = CONCAT44(fVar3 * fVar22 + fVar1 * fVar12 + fVar2 * fVar9,
                      fVar3 * fVar20 + fVar1 * fVar11 + fVar2 * fVar14);
  local_2c = 0;
  local_28.m_floats[1] = fVar8 * fVar18 + fVar13 * fVar16 + fVar10 * fVar21;
  local_28.m_floats[0] = fVar8 * fVar17 + fVar13 * fVar15 + fVar10 * fVar19;
  local_28.m_floats[2] = fVar10 * fVar2 + fVar1 * fVar13 + fVar3 * fVar8;
  local_28.m_floats[3] = 0.0;
  bVar7 = collide(this,&local_28,&local_98,&local_a8,&local_ac,in_R9,
                  this->m_contactBreakingThreshold);
  if (bVar7) {
    if (swapResults) {
      fVar8 = (input->m_transformB).m_basis.m_el[0].m_floats[0];
      fVar10 = (input->m_transformB).m_basis.m_el[0].m_floats[1];
      fVar13 = (input->m_transformB).m_basis.m_el[0].m_floats[2];
      fVar11 = (input->m_transformB).m_basis.m_el[2].m_floats[0];
      fVar12 = (input->m_transformB).m_basis.m_el[2].m_floats[1];
      fVar14 = (input->m_transformB).m_basis.m_el[2].m_floats[2];
      fVar9 = fVar14 * local_a8.m_floats[2] +
              fVar11 * local_a8.m_floats[0] + local_a8.m_floats[1] * fVar12;
      fVar1 = (input->m_transformB).m_basis.m_el[1].m_floats[1];
      fVar2 = (input->m_transformB).m_basis.m_el[1].m_floats[0];
      fVar3 = (input->m_transformB).m_basis.m_el[1].m_floats[2];
      fVar15 = local_a8.m_floats[2] * fVar13 +
               local_a8.m_floats[0] * fVar8 + local_a8.m_floats[1] * fVar10;
      fVar16 = local_a8.m_floats[2] * fVar3 +
               local_a8.m_floats[0] * fVar2 + local_a8.m_floats[1] * fVar1;
      local_68._8_4_ = -fVar9;
      local_68._0_8_ = CONCAT44(fVar16,fVar15) ^ 0x8000000080000000;
      uVar4 = *(undefined8 *)(input->m_transformB).m_origin.m_floats;
      local_78._4_4_ =
           local_ac * fVar16 +
           (float)((ulong)uVar4 >> 0x20) +
           local_98.m_floats[2] * fVar3 +
           local_98.m_floats[0] * fVar2 + local_98.m_floats[1] * fVar1;
      local_78._0_4_ =
           local_ac * fVar15 +
           (float)uVar4 +
           local_98.m_floats[2] * fVar13 +
           local_98.m_floats[0] * fVar8 + local_98.m_floats[1] * fVar10;
      local_78._8_4_ =
           fVar9 * local_ac +
           fVar14 * local_98.m_floats[2] +
           fVar11 * local_98.m_floats[0] + fVar12 * local_98.m_floats[1] +
           (input->m_transformB).m_origin.m_floats[2];
    }
    else {
      fVar8 = (input->m_transformB).m_basis.m_el[0].m_floats[0];
      fVar10 = (input->m_transformB).m_basis.m_el[0].m_floats[1];
      fVar13 = (input->m_transformB).m_basis.m_el[0].m_floats[2];
      fVar11 = (input->m_transformB).m_basis.m_el[1].m_floats[1];
      fVar12 = (input->m_transformB).m_basis.m_el[1].m_floats[0];
      fVar14 = (input->m_transformB).m_basis.m_el[1].m_floats[2];
      fVar1 = (input->m_transformB).m_basis.m_el[2].m_floats[0];
      fVar2 = (input->m_transformB).m_basis.m_el[2].m_floats[1];
      fVar3 = (input->m_transformB).m_basis.m_el[2].m_floats[2];
      local_68._4_4_ =
           local_a8.m_floats[2] * fVar14 +
           local_a8.m_floats[0] * fVar12 + local_a8.m_floats[1] * fVar11;
      local_68._0_4_ =
           local_a8.m_floats[2] * fVar13 +
           local_a8.m_floats[0] * fVar8 + local_a8.m_floats[1] * fVar10;
      local_68._8_4_ =
           local_a8.m_floats[2] * fVar3 +
           local_a8.m_floats[0] * fVar1 + local_a8.m_floats[1] * fVar2;
      uVar4 = *(undefined8 *)(input->m_transformB).m_origin.m_floats;
      local_78._4_4_ =
           (float)((ulong)uVar4 >> 0x20) +
           local_98.m_floats[2] * fVar14 +
           local_98.m_floats[0] * fVar12 + local_98.m_floats[1] * fVar11;
      local_78._0_4_ =
           (float)uVar4 +
           local_98.m_floats[2] * fVar13 +
           local_98.m_floats[0] * fVar8 + local_98.m_floats[1] * fVar10;
      local_78._8_4_ =
           fVar3 * local_98.m_floats[2] +
           fVar1 * local_98.m_floats[0] + fVar2 * local_98.m_floats[1] +
           (input->m_transformB).m_origin.m_floats[2];
    }
    local_68._12_4_ = 0;
    local_78._12_4_ = 0;
    (*output->_vptr_Result[4])(local_ac,output);
  }
  return;
}

Assistant:

void	SphereTriangleDetector::getClosestPoints(const ClosestPointInput& input,Result& output,class btIDebugDraw* debugDraw,bool swapResults)
{

	(void)debugDraw;
	const btTransform& transformA = input.m_transformA;
	const btTransform& transformB = input.m_transformB;

	btVector3 point,normal;
	btScalar timeOfImpact = btScalar(1.);
	btScalar depth = btScalar(0.);
//	output.m_distance = btScalar(BT_LARGE_FLOAT);
	//move sphere into triangle space
	btTransform	sphereInTr = transformB.inverseTimes(transformA);

	if (collide(sphereInTr.getOrigin(),point,normal,depth,timeOfImpact,m_contactBreakingThreshold))
	{
		if (swapResults)
		{
			btVector3 normalOnB = transformB.getBasis()*normal;
			btVector3 normalOnA = -normalOnB;
			btVector3 pointOnA = transformB*point+normalOnB*depth;
			output.addContactPoint(normalOnA,pointOnA,depth);
		} else
		{
			output.addContactPoint(transformB.getBasis()*normal,transformB*point,depth);
		}
	}

}